

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O3

bool __thiscall duckdb::ARTKey::operator>=(ARTKey *this,ARTKey *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  byte bVar7;
  
  uVar1 = this->len;
  uVar2 = key->len;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    bVar7 = uVar2 <= uVar1;
  }
  else {
    bVar7 = *this->data;
    bVar4 = *key->data;
    bVar6 = true;
    uVar5 = 1;
    if (bVar7 <= bVar4) {
      uVar5 = 1;
      do {
        if (bVar7 < bVar4) {
          uVar5 = 0;
          goto LAB_016e39fe;
        }
        bVar6 = uVar5 < uVar3;
        if (uVar5 == uVar3) goto LAB_016e39fe;
        bVar7 = this->data[uVar5];
        bVar4 = key->data[uVar5];
        uVar5 = uVar5 + 1;
      } while (bVar7 <= bVar4);
      uVar5 = 1;
    }
LAB_016e39fe:
    bVar7 = (byte)uVar5;
    if (!bVar6) {
      bVar7 = uVar2 <= uVar1;
    }
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool ARTKey::operator>=(const ARTKey &key) const {
	for (idx_t i = 0; i < MinValue(len, key.len); i++) {
		if (data[i] > key.data[i]) {
			return true;
		} else if (data[i] < key.data[i]) {
			return false;
		}
	}
	return len >= key.len;
}